

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.h
# Opt level: O3

void __thiscall
xLearn::Loss::Initialize
          (Loss *this,Score *score,ThreadPool *pool,bool norm,bool lock_free,index_t batch_size)

{
  ostream *poVar1;
  Logger local_5c;
  string local_58;
  string local_38;
  
  if (score == (Score *)0x0) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    local_5c.severity_ = ERR;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/loss.h",
               "");
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Initialize","");
    poVar1 = Logger::Start(ERR,&local_38,0x52,&local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"CHECK failed ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/loss.h",
               0x52);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x52);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"score",5);
    std::operator<<(poVar1," == NULL \n");
  }
  else {
    if (pool != (ThreadPool *)0x0) {
      this->score_func_ = score;
      this->pool_ = pool;
      this->norm_ = norm;
      this->threadNumber_ =
           (long)(pool->workers).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(pool->workers).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3;
      this->lock_free_ = lock_free;
      this->batch_size_ = batch_size;
      return;
    }
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    local_5c.severity_ = ERR;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/loss.h",
               "");
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Initialize","");
    poVar1 = Logger::Start(ERR,&local_38,0x53,&local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"CHECK failed ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/loss.h",
               0x52);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x53);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"pool",4);
    std::operator<<(poVar1," == NULL \n");
  }
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  Logger::~Logger(&local_5c);
  abort();
}

Assistant:

void Initialize(Score* score, 
                  ThreadPool* pool, 
                  bool norm = true,
                  bool lock_free = false,
                  index_t batch_size = 0) {
    CHECK_NOTNULL(score);
    CHECK_NOTNULL(pool);
    CHECK_GE(batch_size, 0);
    score_func_ = score;
    pool_ = pool;
    norm_ = norm;
    threadNumber_ = pool_->ThreadNumber();
    lock_free_ = lock_free;
    batch_size_ = batch_size;
  }